

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadVertexData(ColladaParser *this,Mesh *pMesh)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  undefined4 extraout_var_00;
  basic_formatter *this_00;
  undefined4 extraout_var_01;
  allocator local_1f1;
  string local_1f0;
  char *local_1d0 [3];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1b8 [376];
  string local_40;
  uint local_1c;
  Mesh *pMStack_18;
  int attrID;
  Mesh *pMesh_local;
  ColladaParser *this_local;
  
  pMStack_18 = pMesh;
  pMesh_local = (Mesh *)this;
  local_1c = GetAttribute(this,"id");
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_1c);
  std::__cxx11::string::operator=
            ((string *)&pMStack_18->mVertexID,(char *)CONCAT44(extraout_var,iVar2));
  while( true ) {
    while( true ) {
      uVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((uVar3 & 1) == 0) {
        return;
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) break;
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_01,iVar2),"vertices");
        if (iVar2 == 0) {
          return;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1f0,"Expected end of <vertices> element.",&local_1f1);
        ThrowException(this,&local_1f0);
      }
    }
    bVar1 = IsElement(this,"input");
    if (!bVar1) break;
    ReadInputChannel(this,&pMStack_18->mPerVertexData);
  }
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
  pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (local_1b8,(char (*) [25])"Unexpected sub element <");
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  local_1d0[0] = (char *)CONCAT44(extraout_var_00,iVar2);
  pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar4,local_1d0);
  this_00 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                      (pbVar4,(char (*) [20])"> in tag <vertices>");
  Formatter::basic_formatter::operator_cast_to_string(&local_40,this_00);
  ThrowException(this,&local_40);
}

Assistant:

void ColladaParser::ReadVertexData(Mesh* pMesh)
{
    // extract the ID of the <vertices> element. Not that we care, but to catch strange referencing schemes we should warn about
    int attrID = GetAttribute("id");
    pMesh->mVertexID = mReader->getAttributeValue(attrID);

    // a number of <input> elements
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("input"))
            {
                ReadInputChannel(pMesh->mPerVertexData);
            }
            else
            {
                ThrowException(format() << "Unexpected sub element <" << mReader->getNodeName() << "> in tag <vertices>");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "vertices") != 0)
                ThrowException("Expected end of <vertices> element.");

            break;
        }
    }
}